

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O1

bool __thiscall r_exec::HLPOverlay::scan_variable(HLPOverlay *this,uint16_t index)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  undefined8 in_RAX;
  ulong uVar6;
  byte unaff_R15B;
  Atom a;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  uVar4 = r_code::Atom::asIndex();
  bVar2 = r_code::Atom::getAtomCount();
  if (bVar2 != 0) {
    uVar6 = (ulong)bVar2;
    do {
      uVar4 = uVar4 + 1;
      uStack_38 = CONCAT44(*(undefined4 *)((this->super_Overlay).code + (ulong)uVar4 * 4),
                           (undefined4)uStack_38);
      cVar3 = r_code::Atom::getDescriptor();
      bVar1 = true;
      if (cVar3 == -0x73) {
        uVar5 = r_code::Atom::asIndex();
        if (uVar4 == uVar5) {
          bVar2 = r_code::Atom::asAssignmentIndex();
          unaff_R15B = scan_location(this,(ushort)bVar2);
          bVar1 = false;
        }
      }
      r_code::Atom::~Atom((Atom *)((long)&uStack_38 + 4));
      if (!bVar1) goto LAB_0017721f;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  unaff_R15B = 0;
LAB_0017721f:
  return (bool)(unaff_R15B & 1);
}

Assistant:

bool HLPOverlay::scan_variable(uint16_t index)   // check if the variable can be bound.
{
    uint16_t guard_set_index = code[HLP_BWD_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) {
        uint16_t index = guard_set_index + i;
        Atom a = code[index];

        switch (a.getDescriptor()) {
        case Atom::ASSIGN_PTR:
            if (a.asIndex() == index) {
                return scan_location(a.asAssignmentIndex());
            }

            break;
        }
    }

    return false;
}